

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O3

void Fx_ManFindCommonPairs
               (Vec_Wec_t *vCubes,Vec_Int_t *vPart0,Vec_Int_t *vPart1,Vec_Int_t *vPairs,
               Vec_Int_t *vCompls,Vec_Int_t *vDiv,Vec_Int_t *vCubeFree,int *fWarning)

{
  uint *puVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  uint *puVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  uint *puVar13;
  uint *puVar14;
  ulong uVar15;
  uint *puVar16;
  ulong local_80;
  uint *local_78;
  
  puVar16 = (uint *)vPart0->pArray;
  puVar7 = (uint *)vPart1->pArray;
  iVar4 = vPart0->nSize;
  iVar2 = vPart1->nSize;
  vPairs->nSize = 0;
  vCompls->nSize = 0;
  if (0 < iVar2 && 0 < (long)iVar4) {
    puVar13 = puVar16 + iVar4;
    puVar1 = puVar7 + iVar2;
    do {
      lVar6 = (long)(int)*puVar16;
      if ((lVar6 < 0) || (uVar5 = vCubes->nSize, (int)uVar5 <= (int)*puVar16)) {
LAB_0025cd77:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWec.h"
                      ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pVVar3 = vCubes->pArray;
      if (pVVar3[lVar6].nSize < 1) {
LAB_0025cd96:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      lVar10 = (long)(int)*puVar7;
      if ((lVar10 < 0) || (uVar5 <= *puVar7)) goto LAB_0025cd77;
      if (pVVar3[lVar10].nSize < 1) goto LAB_0025cd96;
      iVar4 = *pVVar3[lVar6].pArray;
      if (iVar4 == *pVVar3[lVar10].pArray) {
        puVar14 = puVar16 + 1;
        uVar8 = 1;
        uVar11 = 1;
        if (puVar14 < puVar13) {
          do {
            uVar9 = (uint)uVar11;
            lVar6 = (long)(int)*puVar14;
            if ((lVar6 < 0) || (uVar5 <= *puVar14)) goto LAB_0025cd77;
            if (pVVar3[lVar6].nSize < 1) goto LAB_0025cd96;
            if (iVar4 != *pVVar3[lVar6].pArray) break;
            uVar11 = uVar11 + 1;
            uVar9 = (uint)uVar11;
            puVar14 = puVar14 + 1;
          } while (puVar14 < puVar13);
          uVar11 = (ulong)uVar9;
        }
        local_78 = puVar7 + 1;
        if (local_78 < puVar1) {
          uVar8 = 1;
          do {
            lVar6 = (long)(int)*local_78;
            if ((lVar6 < 0) || (uVar5 <= *local_78)) goto LAB_0025cd77;
            if (pVVar3[lVar6].nSize < 1) goto LAB_0025cd96;
            if (iVar4 != *pVVar3[lVar6].pArray) break;
            uVar8 = uVar8 + 1;
            local_78 = local_78 + 1;
          } while (local_78 < puVar1);
          uVar8 = uVar8 & 0xffffffff;
        }
        local_80 = 0;
        do {
          uVar15 = 0;
          do {
            uVar5 = puVar16[local_80];
            uVar9 = puVar7[uVar15];
            if (uVar5 != uVar9) {
              if (((((int)uVar5 < 0) || (vCubes->nSize <= (int)uVar5)) || ((int)uVar9 < 0)) ||
                 ((uint)vCubes->nSize <= uVar9)) goto LAB_0025cd77;
              Fx_ManDivFindCubeFree
                        (vCubes->pArray + uVar5,vCubes->pArray + uVar9,vCubeFree,fWarning);
              uVar5 = vCubeFree->nSize;
              uVar9 = 0;
              if (uVar5 == 4) {
                iVar4 = Fx_ManDivNormalize((Vec_Int_t *)&DAT_00000004);
                uVar9 = (uint)(iVar4 == 1);
                uVar5 = vCubeFree->nSize;
              }
              if (vDiv->nSize == uVar5) {
                if (0 < (int)uVar5) {
                  uVar12 = 0;
                  do {
                    if (vDiv->pArray[uVar12] != vCubeFree->pArray[uVar12]) goto LAB_0025cd22;
                    uVar12 = uVar12 + 1;
                  } while (uVar5 != uVar12);
                }
                Vec_IntPush(vPairs,puVar16[local_80]);
                Vec_IntPush(vPairs,puVar7[uVar15]);
                Vec_IntPush(vCompls,uVar9);
              }
            }
LAB_0025cd22:
            uVar15 = uVar15 + 1;
          } while (uVar15 != uVar8);
          local_80 = local_80 + 1;
        } while (local_80 != uVar11);
      }
      else if (iVar4 < *pVVar3[lVar10].pArray) {
        local_78 = puVar7;
        puVar14 = puVar16 + 1;
      }
      else {
        local_78 = puVar7 + 1;
        puVar14 = puVar16;
      }
    } while ((puVar14 < puVar13) && (puVar7 = local_78, puVar16 = puVar14, local_78 < puVar1));
  }
  return;
}

Assistant:

void Fx_ManFindCommonPairs( Vec_Wec_t * vCubes, Vec_Int_t * vPart0, Vec_Int_t * vPart1, Vec_Int_t * vPairs, Vec_Int_t * vCompls, Vec_Int_t * vDiv, Vec_Int_t * vCubeFree, int * fWarning )
{
    int * pBeg1 = vPart0->pArray;
    int * pBeg2 = vPart1->pArray;
    int * pEnd1 = vPart0->pArray + vPart0->nSize;
    int * pEnd2 = vPart1->pArray + vPart1->nSize;
    int i, k, i_, k_, fCompl, CubeId1, CubeId2;
    Vec_IntClear( vPairs );
    Vec_IntClear( vCompls );
    while ( pBeg1 < pEnd1 && pBeg2 < pEnd2 )
    {
        CubeId1 = Fx_ManGetCubeVar(vCubes, *pBeg1);
        CubeId2 = Fx_ManGetCubeVar(vCubes, *pBeg2);
        if ( CubeId1 == CubeId2 )
        {
            for ( i = 1; pBeg1+i < pEnd1; i++ )
                if ( CubeId1 != Fx_ManGetCubeVar(vCubes, pBeg1[i]) )
                    break;
            for ( k = 1; pBeg2+k < pEnd2; k++ )
                if ( CubeId1 != Fx_ManGetCubeVar(vCubes, pBeg2[k]) )
                    break;
            for ( i_ = 0; i_ < i; i_++ )
            for ( k_ = 0; k_ < k; k_++ )
            {
                if ( pBeg1[i_] == pBeg2[k_] )
                    continue;
                Fx_ManDivFindCubeFree( Vec_WecEntry(vCubes, pBeg1[i_]), Vec_WecEntry(vCubes, pBeg2[k_]), vCubeFree, fWarning );
                fCompl = (Vec_IntSize(vCubeFree) == 4 && Fx_ManDivNormalize(vCubeFree) == 1);
                if ( !Vec_IntEqual( vDiv, vCubeFree ) )
                    continue;
                Vec_IntPush( vPairs, pBeg1[i_] );
                Vec_IntPush( vPairs, pBeg2[k_] );
                Vec_IntPush( vCompls, fCompl );
            }
            pBeg1 += i;
            pBeg2 += k;
        }
        else if ( CubeId1 < CubeId2 )
            pBeg1++;
        else 
            pBeg2++;
    }
}